

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

void __thiscall
GlobOptBlockData::MergeBlockData
          (GlobOptBlockData *this,BasicBlock *toBlock,BasicBlock *fromBlock,
          BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation,
          BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge,bool forceTypeSpecOnLoopHeader)

{
  Loop *pLVar1;
  code *pcVar2;
  anon_class_16_2_b01b82c3 itemsAreEqual;
  bool bVar3;
  SymID id_00;
  JitArenaAllocator *pJVar4;
  BVSparse<Memory::JitArenaAllocator> *pBVar5;
  StackSym *sym;
  undefined4 *puVar6;
  Value *this_00;
  ValueInfo *pVVar7;
  BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar8;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
  *local_198;
  CapturedValues *local_188;
  StackLiteralInitFldDataMap *toMap;
  ValueInfo *valueInfo;
  Value *value;
  StackSym *stackSym;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  undefined1 local_128 [4];
  BVIndex id;
  BVSparse<Memory::JitArenaAllocator> tempBv4;
  BVSparse<Memory::JitArenaAllocator> tempBv3;
  Loop *loop;
  undefined1 local_d0 [8];
  BVSparse<Memory::JitArenaAllocator> tempBv2;
  BVSparse<Memory::JitArenaAllocator> tempBv1;
  TrackAllocData local_80;
  GlobOptBlockData **local_58;
  GlobOptBlockData *local_50;
  byte local_41;
  GlobOptBlockData *pGStack_40;
  bool isLoopBackEdge;
  GlobOptBlockData *fromData;
  BVSparse<Memory::JitArenaAllocator> *pBStack_30;
  bool forceTypeSpecOnLoopHeader_local;
  BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge_local;
  BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation_local;
  BasicBlock *fromBlock_local;
  BasicBlock *toBlock_local;
  GlobOptBlockData *this_local;
  
  pGStack_40 = &fromBlock->globOptData;
  fromData._7_1_ = forceTypeSpecOnLoopHeader;
  pBStack_30 = symsCreatedForMerge;
  symsCreatedForMerge_local = symsRequiringCompensation;
  symsRequiringCompensation_local = (BVSparse<Memory::JitArenaAllocator> *)fromBlock;
  fromBlock_local = toBlock;
  toBlock_local = (BasicBlock *)this;
  bVar3 = GlobOpt::DoBoundCheckHoist(this->globOpt);
  if (bVar3) {
    GlobOpt::MergeBoundCheckHoistBlockData
              (this->globOpt,fromBlock_local,this,(BasicBlock *)symsRequiringCompensation_local,
               pGStack_40);
  }
  local_41 = (*(ushort *)&fromBlock_local->field_0x18 >> 2 & 1) != 0;
  MergeValueMaps(this,fromBlock_local,(BasicBlock *)symsRequiringCompensation_local,
                 symsCreatedForMerge_local,pBStack_30);
  GlobOpt::InsertCloneStrs(this->globOpt,fromBlock_local,this,pGStack_40);
  BVSparse<Memory::JitArenaAllocator>::And(this->liveFields,pGStack_40->liveFields);
  BVSparse<Memory::JitArenaAllocator>::And(this->liveArrayValues,pGStack_40->liveArrayValues);
  BVSparse<Memory::JitArenaAllocator>::And(this->isTempSrc,pGStack_40->isTempSrc);
  this->hasCSECandidates = (this->hasCSECandidates & 1U & pGStack_40->hasCSECandidates & 1U) != 0;
  BVSparse<Memory::JitArenaAllocator>::Or(this->changedSyms,pGStack_40->changedSyms);
  if (this->capturedValues == (CapturedValues *)0x0) {
    this->capturedValues = pGStack_40->capturedValues;
    if (this->capturedValues != (CapturedValues *)0x0) {
      CapturedValues::IncrementRefCount(this->capturedValues);
    }
  }
  else {
    if (pGStack_40->capturedValues == (CapturedValues *)0x0) {
      local_188 = (CapturedValues *)0x0;
    }
    else {
      local_188 = pGStack_40->capturedValues;
    }
    MergeCapturedValues<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,GlobOptBlockData::MergeBlockData(BasicBlock*,BasicBlock*,BVSparse<Memory::JitArenaAllocator>*,BVSparse<Memory::JitArenaAllocator>*,bool)::__0>
              (this,this->capturedValues,local_188);
    if (pGStack_40->capturedValues == (CapturedValues *)0x0) {
      local_198 = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                   *)0x0;
    }
    else {
      local_198 = &pGStack_40->capturedValues->copyPropSyms;
    }
    local_58 = &stack0xffffffffffffffc0;
    itemsAreEqual.this = this;
    itemsAreEqual.fromData = local_58;
    local_50 = this;
    MergeCapturedValues<JsUtil::KeyValuePair<StackSym*,StackSym*>,GlobOptBlockData::MergeBlockData(BasicBlock*,BasicBlock*,BVSparse<Memory::JitArenaAllocator>*,BVSparse<Memory::JitArenaAllocator>*,bool)::__1>
              (this,&this->capturedValues->copyPropSyms,local_198,itemsAreEqual);
  }
  if (pGStack_40->maybeWrittenTypeSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    if (this->maybeWrittenTypeSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pJVar4 = this->globOpt->alloc;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_80,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                 ,0x1e9);
      pJVar4 = (JitArenaAllocator *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                              pJVar4,&local_80);
      pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
               new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
      BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar5,this->globOpt->alloc);
      this->maybeWrittenTypeSyms = pBVar5;
      BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
                (this->maybeWrittenTypeSyms,pGStack_40->maybeWrittenTypeSyms);
    }
    else {
      BVSparse<Memory::JitArenaAllocator>::Or
                (this->maybeWrittenTypeSyms,pGStack_40->maybeWrittenTypeSyms);
    }
  }
  BVSparse<Memory::JitArenaAllocator>::BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
             this->globOpt->tempAlloc);
  BVSparse<Memory::JitArenaAllocator>::BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)local_d0,this->globOpt->tempAlloc);
  if (((local_41 & 1) != 0) && ((fromData._7_1_ & 1) != 0)) {
    pLVar1 = fromBlock_local->loop;
    BVSparse<Memory::JitArenaAllocator>::Minus
              ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
               pGStack_40->liveInt32Syms,pGStack_40->liveLossyInt32Syms);
    BVSparse<Memory::JitArenaAllocator>::Minus
              ((BVSparse<Memory::JitArenaAllocator> *)local_d0,this->liveInt32Syms,
               this->liveLossyInt32Syms);
    BVSparse<Memory::JitArenaAllocator>::Minus
              ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
               (BVSparse<Memory::JitArenaAllocator> *)local_d0);
    BVSparse<Memory::JitArenaAllocator>::And
              ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
               pLVar1->likelyIntSymsUsedBeforeDefined);
    BVSparse<Memory::JitArenaAllocator>::And
              ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
               this->liveVarSyms);
    BVSparse<Memory::JitArenaAllocator>::Or
              (this->liveInt32Syms,
               (BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField);
    BVSparse<Memory::JitArenaAllocator>::Minus
              (this->liveLossyInt32Syms,
               (BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField);
    bVar3 = GlobOpt::DoLossyIntTypeSpec(this->globOpt);
    if (bVar3) {
      BVSparse<Memory::JitArenaAllocator>::Minus
                ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
                 pGStack_40->liveInt32Syms,this->liveInt32Syms);
      BVSparse<Memory::JitArenaAllocator>::And
                ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
                 pLVar1->symsUsedBeforeDefined);
      BVSparse<Memory::JitArenaAllocator>::And
                ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
                 this->liveVarSyms);
      BVSparse<Memory::JitArenaAllocator>::Or
                (this->liveInt32Syms,
                 (BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField);
      BVSparse<Memory::JitArenaAllocator>::Or
                (this->liveLossyInt32Syms,
                 (BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField);
    }
    BVSparse<Memory::JitArenaAllocator>::And
              ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
               pGStack_40->liveFloat64Syms,pLVar1->forceFloat64SymsOnEntry);
    BVSparse<Memory::JitArenaAllocator>::Or
              (this->liveFloat64Syms,
               (BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField);
    BVSparse<Memory::JitArenaAllocator>::Minus
              ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
               pGStack_40->liveFloat64Syms,this->liveFloat64Syms);
    BVSparse<Memory::JitArenaAllocator>::And
              ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
               pLVar1->likelyNumberSymsUsedBeforeDefined);
    BVSparse<Memory::JitArenaAllocator>::Or
              (this->liveFloat64Syms,
               (BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField);
  }
  BVSparse<Memory::JitArenaAllocator>::BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)&tempBv4.lastUsedNodePrevNextField,
             this->globOpt->tempAlloc);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)local_d0,pGStack_40->liveInt32Syms,
             pGStack_40->liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
             pGStack_40->liveVarSyms,(BVSparse<Memory::JitArenaAllocator> *)local_d0);
  BVSparse<Memory::JitArenaAllocator>::Or
            ((BVSparse<Memory::JitArenaAllocator> *)local_d0,this->liveVarSyms,this->liveInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::Or
            ((BVSparse<Memory::JitArenaAllocator> *)local_d0,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::And
            ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
             (BVSparse<Memory::JitArenaAllocator> *)local_d0);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)&tempBv4.lastUsedNodePrevNextField,
             this->liveInt32Syms,this->liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)local_d0,this->liveVarSyms,
             (BVSparse<Memory::JitArenaAllocator> *)&tempBv4.lastUsedNodePrevNextField);
  BVSparse<Memory::JitArenaAllocator>::Or
            ((BVSparse<Memory::JitArenaAllocator> *)&tempBv4.lastUsedNodePrevNextField,
             pGStack_40->liveVarSyms,pGStack_40->liveInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::Or
            ((BVSparse<Memory::JitArenaAllocator> *)&tempBv4.lastUsedNodePrevNextField,
             pGStack_40->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::And
            ((BVSparse<Memory::JitArenaAllocator> *)local_d0,
             (BVSparse<Memory::JitArenaAllocator> *)&tempBv4.lastUsedNodePrevNextField);
  BVSparse<Memory::JitArenaAllocator>::BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)local_128,this->globOpt->tempAlloc);
  BVSparse<Memory::JitArenaAllocator>::And
            ((BVSparse<Memory::JitArenaAllocator> *)&tempBv4.lastUsedNodePrevNextField,
             (BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
             pGStack_40->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::And
            ((BVSparse<Memory::JitArenaAllocator> *)local_128,
             (BVSparse<Memory::JitArenaAllocator> *)local_d0,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::Or
            ((BVSparse<Memory::JitArenaAllocator> *)&tempBv4.lastUsedNodePrevNextField,
             (BVSparse<Memory::JitArenaAllocator> *)local_128);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse((BVSparse<Memory::JitArenaAllocator> *)local_128);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
             pGStack_40->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)local_d0,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::Or
            ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
             (BVSparse<Memory::JitArenaAllocator> *)local_d0);
  BVSparse<Memory::JitArenaAllocator>::And(this->liveVarSyms,pGStack_40->liveVarSyms);
  BVSparse<Memory::JitArenaAllocator>::Or
            (this->liveVarSyms,
             (BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField);
  for (__startIndex = (BVSparseNode<Memory::JitArenaAllocator> *)tempBv4.lastUsedNodePrevNextField;
      __startIndex != (BVSparseNode<Memory::JitArenaAllocator> *)0x0;
      __startIndex = __startIndex->next) {
    _unit.word._0_4_ = __startIndex->startIndex;
    stackSym = *(StackSym **)&__startIndex->data;
    _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&stackSym);
    while (_unit.word._4_4_ != 0xffffffff) {
      id_00 = (int)_unit.word + _unit.word._4_4_;
      BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&stackSym,_unit.word._4_4_);
      sym = SymTable::FindStackSym(this->globOpt->func->m_symTable,id_00);
      if (sym == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                           ,0x270,"(stackSym)","stackSym");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      this_00 = FindValue(this,&sym->super_Sym);
      if (this_00 != (Value *)0x0) {
        pVVar7 = ::Value::GetValueInfo(this_00);
        bVar3 = ValueType::IsInt(&pVVar7->super_ValueType);
        if ((bVar3) ||
           ((bVar3 = ValueType::IsLikelyInt(&pVVar7->super_ValueType), bVar3 &&
            (bVar3 = GlobOpt::DoAggressiveIntTypeSpec(this->globOpt), bVar3)))) {
          BVSparse<Memory::JitArenaAllocator>::Set(this->liveVarSyms,id_00);
        }
      }
      _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&stackSym);
    }
    if (__startIndex == (BVSparseNode<Memory::JitArenaAllocator> *)0x0) break;
  }
  BVSparse<Memory::JitArenaAllocator>::~BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)&tempBv4.lastUsedNodePrevNextField);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
             this->liveInt32Syms,this->liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::Or
            ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
             this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::And
            ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
             pGStack_40->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)local_d0,pGStack_40->liveInt32Syms,
             pGStack_40->liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::Or
            ((BVSparse<Memory::JitArenaAllocator> *)local_d0,pGStack_40->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::And
            ((BVSparse<Memory::JitArenaAllocator> *)local_d0,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::Or
            (this->liveFloat64Syms,
             (BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
             (BVSparse<Memory::JitArenaAllocator> *)local_d0);
  BVSparse<Memory::JitArenaAllocator>::And(this->liveInt32Syms,pGStack_40->liveInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::Or(this->liveLossyInt32Syms,pGStack_40->liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::And(this->liveLossyInt32Syms,this->liveInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse((BVSparse<Memory::JitArenaAllocator> *)local_d0);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField);
  bVar3 = GlobOpt::TrackArgumentsObject(this->globOpt);
  if ((bVar3) &&
     (bVar3 = BVSparse<Memory::JitArenaAllocator>::Equal(this->argObjSyms,pGStack_40->argObjSyms),
     !bVar3)) {
    GlobOpt::CannotAllocateArgumentsObjectOnStack(this->globOpt,(Func *)0x0);
  }
  if ((pGStack_40->maybeTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) ||
     (bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pGStack_40->maybeTempObjectSyms), bVar3))
  {
    if ((pGStack_40->canStoreTempObjectSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
       (bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pGStack_40->canStoreTempObjectSyms),
       !bVar3)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x2b5,
                         "(!fromData->canStoreTempObjectSyms || fromData->canStoreTempObjectSyms->IsEmpty())"
                         ,
                         "!fromData->canStoreTempObjectSyms || fromData->canStoreTempObjectSyms->IsEmpty()"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if (this->canStoreTempObjectSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      BVSparse<Memory::JitArenaAllocator>::ClearAll(this->canStoreTempObjectSyms);
    }
  }
  else {
    if (this->maybeTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pBVar5 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                         (pGStack_40->maybeTempObjectSyms,this->globOpt->alloc);
      this->maybeTempObjectSyms = pBVar5;
    }
    else {
      BVSparse<Memory::JitArenaAllocator>::Or
                (this->maybeTempObjectSyms,pGStack_40->maybeTempObjectSyms);
    }
    if ((pGStack_40->canStoreTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) ||
       (bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pGStack_40->canStoreTempObjectSyms),
       bVar3)) {
      if (this->canStoreTempObjectSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        BVSparse<Memory::JitArenaAllocator>::ClearAll(this->canStoreTempObjectSyms);
      }
    }
    else if (this->canStoreTempObjectSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      BVSparse<Memory::JitArenaAllocator>::And
                (this->canStoreTempObjectSyms,pGStack_40->canStoreTempObjectSyms);
    }
  }
  if (this->curFunc != pGStack_40->curFunc) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,700,"(this->curFunc == fromData->curFunc)",
                       "this->curFunc == fromData->curFunc");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (((this->callSequence != (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
      (pGStack_40->callSequence != (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0))
     && (bVar3 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Equals
                           (this->callSequence,pGStack_40->callSequence), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x2bd,
                       "((this->callSequence == nullptr && fromData->callSequence == nullptr) || this->callSequence->Equals(*(fromData->callSequence)))"
                       ,
                       "(this->callSequence == nullptr && fromData->callSequence == nullptr) || this->callSequence->Equals(*(fromData->callSequence))"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (this->startCallCount != pGStack_40->startCallCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x2be,"(this->startCallCount == fromData->startCallCount)",
                       "this->startCallCount == fromData->startCallCount");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (this->argOutCount != pGStack_40->argOutCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x2bf,"(this->argOutCount == fromData->argOutCount)",
                       "this->argOutCount == fromData->argOutCount");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (this->totalOutParamCount != pGStack_40->totalOutParamCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x2c0,"(this->totalOutParamCount == fromData->totalOutParamCount)",
                       "this->totalOutParamCount == fromData->totalOutParamCount");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (this->inlinedArgOutSize != pGStack_40->inlinedArgOutSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x2c1,"(this->inlinedArgOutSize == fromData->inlinedArgOutSize)",
                       "this->inlinedArgOutSize == fromData->inlinedArgOutSize");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((pGStack_40->stackLiteralInitFldDataMap != (StackLiteralInitFldDataMap *)0x0) &&
     ((bVar3 = GlobOpt::IsLoopPrePass(this->globOpt), !bVar3 ||
      (((*(ushort *)&fromBlock_local->field_0x18 >> 2 & 1) != 0 &&
       (fromBlock_local->loop == this->globOpt->rootLoopPrePass)))))) {
    if (this->stackLiteralInitFldDataMap == (StackLiteralInitFldDataMap *)0x0) {
      pBVar8 = JsUtil::
               BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::Clone(pGStack_40->stackLiteralInitFldDataMap);
      this->stackLiteralInitFldDataMap = pBVar8;
    }
    else {
      JsUtil::
      BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Map<GlobOptBlockData::MergeBlockData(BasicBlock*,BasicBlock*,BVSparse<Memory::JitArenaAllocator>*,BVSparse<Memory::JitArenaAllocator>*,bool)::__2>
                ((BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)pGStack_40->stackLiteralInitFldDataMap,this->stackLiteralInitFldDataMap);
    }
  }
  return;
}

Assistant:

void
GlobOptBlockData::MergeBlockData(
    BasicBlock *toBlock,
    BasicBlock *fromBlock,
    BVSparse<JitArenaAllocator> *const symsRequiringCompensation,
    BVSparse<JitArenaAllocator> *const symsCreatedForMerge,
    bool forceTypeSpecOnLoopHeader)
{
    GlobOptBlockData *fromData = &(fromBlock->globOptData);

    if(this->globOpt->DoBoundCheckHoist())
    {
        // Do this before merging values so that it can see whether a sym's value was changed on one side or the other
        this->globOpt->MergeBoundCheckHoistBlockData(toBlock, this, fromBlock, fromData);
    }

    bool isLoopBackEdge = toBlock->isLoopHeader;
    this->MergeValueMaps(toBlock, fromBlock, symsRequiringCompensation, symsCreatedForMerge);

    this->globOpt->InsertCloneStrs(toBlock, this, fromData);

    this->liveFields->And(fromData->liveFields);
    this->liveArrayValues->And(fromData->liveArrayValues);
    this->isTempSrc->And(fromData->isTempSrc);
    this->hasCSECandidates &= fromData->hasCSECandidates;

    this->changedSyms->Or(fromData->changedSyms);
    if (this->capturedValues == nullptr)
    {
        this->capturedValues = fromData->capturedValues;
        if (this->capturedValues)
        {
            this->capturedValues->IncrementRefCount();
        }
    }
    else
    {
        this->MergeCapturedValues(
            &this->capturedValues->constantValues,
            fromData->capturedValues == nullptr ? nullptr : &fromData->capturedValues->constantValues,
            [&](ConstantStackSymValue * symValueFrom, ConstantStackSymValue * symValueTo)
            {
                Assert(symValueFrom->Key()->m_id == symValueTo->Key()->m_id);
                return symValueFrom->Value().IsEqual(symValueTo->Value());
            });

        this->MergeCapturedValues(
            &this->capturedValues->copyPropSyms,
            fromData->capturedValues == nullptr ? nullptr : &fromData->capturedValues->copyPropSyms,
            [&](CopyPropSyms * copyPropSymFrom, CopyPropSyms * copyPropSymTo)
            {
                Assert(copyPropSymFrom->Key()->m_id == copyPropSymTo->Key()->m_id);
                if (copyPropSymFrom->Value()->m_id == copyPropSymTo->Value()->m_id)
                {
                    Value * fromVal = fromData->FindValue(copyPropSymFrom->Key());
                    Value * toVal = this->FindValue(copyPropSymFrom->Key());
                    return fromVal && toVal && fromVal->IsEqualTo(toVal);
                }
                return false;
            });
    }

    if (fromData->maybeWrittenTypeSyms)
    {
        if (this->maybeWrittenTypeSyms == nullptr)
        {
            this->maybeWrittenTypeSyms = JitAnew(this->globOpt->alloc, BVSparse<JitArenaAllocator>, this->globOpt->alloc);
            this->maybeWrittenTypeSyms->Copy(fromData->maybeWrittenTypeSyms);
        }
        else
        {
            this->maybeWrittenTypeSyms->Or(fromData->maybeWrittenTypeSyms);
        }
    }

    {
        // - Keep the var sym live if any of the following is true:
        //     - The var sym is live on both sides
        //     - The var sym is the only live sym that contains the lossless value of the sym on a side (that is, the lossless
        //       int32 sym is not live, and the float64 sym is not live on that side), and the sym of any type is live on the
        //       other side
        //     - On a side, the var and float64 syms are live, the lossless int32 sym is not live, the sym's merged value is
        //       likely int, and the sym of any type is live on the other side. Since the value is likely int, it may be
        //       int-specialized (with lossless conversion) later. Keeping only the float64 sym live requires doing a lossless
        //       conversion from float64 to int32, with bailout if the value of the float is not a true 32-bit integer. Checking
        //       that is costly, and if the float64 sym is converted back to var, it does not become a tagged int, causing a
        //       guaranteed bailout if a lossless conversion to int happens later. Keep the var sym live to preserve its
        //       tagged-ness so that it can be int-specialized while avoiding unnecessary bailouts.
        // - Keep the int32 sym live if it's live on both sides
        //     - Mark the sym as lossy if it's lossy on any side
        // - Keep the float64 sym live if it's live on a side and the sym of a specialized lossless type is live on the other
        //   side
        //
        // fromData.temp =
        //     (fromData.var - (fromData.int32 - fromData.lossyInt32)) &
        //     (this.var | this.int32 | this.float64)
        // this.temp =
        //     (this.var - (this.int32 - this.lossyInt32)) &
        //     (fromData.var | fromData.int32 | fromData.float64)
        // this.var =
        //     (fromData.var & this.var) |
        //     (fromData.temp - fromData.float64) |
        //     (this.temp - this.float64) |
        //     (fromData.temp & fromData.float64 | this.temp & this.float64) & (value ~ int)
        //
        // this.float64 =
        //     fromData.float64 & ((this.int32 - this.lossyInt32) | this.float64) |
        //     this.float64 & ((fromData.int32 - fromData.lossyInt32) | fromData.float64)
        // this.int32 &= fromData.int32
        // this.lossyInt32 = (fromData.lossyInt32 | this.lossyInt32) & this.int32

        BVSparse<JitArenaAllocator> tempBv1(this->globOpt->tempAlloc);
        BVSparse<JitArenaAllocator> tempBv2(this->globOpt->tempAlloc);

        if (isLoopBackEdge && forceTypeSpecOnLoopHeader)
        {
            Loop *const loop = toBlock->loop;

            // Force to lossless int32:
            // forceLosslessInt32 =
            //     ((fromData.int32 - fromData.lossyInt32) - (this.int32 - this.lossyInt32)) &
            //     loop.likelyIntSymsUsedBeforeDefined &
            //     this.var
            tempBv1.Minus(fromData->liveInt32Syms, fromData->liveLossyInt32Syms);
            tempBv2.Minus(this->liveInt32Syms, this->liveLossyInt32Syms);
            tempBv1.Minus(&tempBv2);
            tempBv1.And(loop->likelyIntSymsUsedBeforeDefined);
            tempBv1.And(this->liveVarSyms);
            this->liveInt32Syms->Or(&tempBv1);
            this->liveLossyInt32Syms->Minus(&tempBv1);

            if(this->globOpt->DoLossyIntTypeSpec())
            {
                // Force to lossy int32:
                // forceLossyInt32 = (fromData.int32 - this.int32) & loop.symsUsedBeforeDefined & this.var
                tempBv1.Minus(fromData->liveInt32Syms, this->liveInt32Syms);
                tempBv1.And(loop->symsUsedBeforeDefined);
                tempBv1.And(this->liveVarSyms);
                this->liveInt32Syms->Or(&tempBv1);
                this->liveLossyInt32Syms->Or(&tempBv1);
            }

            // Force to float64:
            // forceFloat64 =
            //     fromData.float64 & loop.forceFloat64 |
            //     (fromData.float64 - this.float64) & loop.likelyNumberSymsUsedBeforeDefined
            tempBv1.And(fromData->liveFloat64Syms, loop->forceFloat64SymsOnEntry);
            this->liveFloat64Syms->Or(&tempBv1);
            tempBv1.Minus(fromData->liveFloat64Syms, this->liveFloat64Syms);
            tempBv1.And(loop->likelyNumberSymsUsedBeforeDefined);
            this->liveFloat64Syms->Or(&tempBv1);
        }

        {
            BVSparse<JitArenaAllocator> tempBv3(this->globOpt->tempAlloc);

            // fromData.temp =
            //     (fromData.var - (fromData.int32 - fromData.lossyInt32)) &
            //     (this.var | this.int32 | this.float64)
            tempBv2.Minus(fromData->liveInt32Syms, fromData->liveLossyInt32Syms);
            tempBv1.Minus(fromData->liveVarSyms, &tempBv2);
            tempBv2.Or(this->liveVarSyms, this->liveInt32Syms);
            tempBv2.Or(this->liveFloat64Syms);
            tempBv1.And(&tempBv2);

            // this.temp =
            //     (this.var - (this.int32 - this.lossyInt32)) &
            //     (fromData.var | fromData.int32 | fromData.float64)
            tempBv3.Minus(this->liveInt32Syms, this->liveLossyInt32Syms);
            tempBv2.Minus(this->liveVarSyms, &tempBv3);
            tempBv3.Or(fromData->liveVarSyms, fromData->liveInt32Syms);
            tempBv3.Or(fromData->liveFloat64Syms);
            tempBv2.And(&tempBv3);

            {
                BVSparse<JitArenaAllocator> tempBv4(this->globOpt->tempAlloc);

                // fromData.temp & fromData.float64 | this.temp & this.float64
                tempBv3.And(&tempBv1, fromData->liveFloat64Syms);
                tempBv4.And(&tempBv2, this->liveFloat64Syms);
                tempBv3.Or(&tempBv4);
            }

            //     (fromData.temp - fromData.float64) |
            //     (this.temp - this.float64)
            tempBv1.Minus(fromData->liveFloat64Syms);
            tempBv2.Minus(this->liveFloat64Syms);
            tempBv1.Or(&tempBv2);

            // this.var =
            //     (fromData.var & this.var) |
            //     (fromData.temp - fromData.float64) |
            //     (this.temp - this.float64)
            this->liveVarSyms->And(fromData->liveVarSyms);
            this->liveVarSyms->Or(&tempBv1);

            // this.var |=
            //     (fromData.temp & fromData.float64 | this.temp & this.float64) & (value ~ int)
            FOREACH_BITSET_IN_SPARSEBV(id, &tempBv3)
            {
                StackSym *const stackSym = this->globOpt->func->m_symTable->FindStackSym(id);
                Assert(stackSym);
                Value *const value = this->FindValue(stackSym);
                if(value)
                {
                    ValueInfo *const valueInfo = value->GetValueInfo();
                    if(valueInfo->IsInt() || (valueInfo->IsLikelyInt() && this->globOpt->DoAggressiveIntTypeSpec()))
                    {
                        this->liveVarSyms->Set(id);
                    }
                }
            } NEXT_BITSET_IN_SPARSEBV;
        }

        //     fromData.float64 & ((this.int32 - this.lossyInt32) | this.float64)
        tempBv1.Minus(this->liveInt32Syms, this->liveLossyInt32Syms);
        tempBv1.Or(this->liveFloat64Syms);
        tempBv1.And(fromData->liveFloat64Syms);

        //     this.float64 & ((fromData.int32 - fromData.lossyInt32) | fromData.float64)
        tempBv2.Minus(fromData->liveInt32Syms, fromData->liveLossyInt32Syms);
        tempBv2.Or(fromData->liveFloat64Syms);
        tempBv2.And(this->liveFloat64Syms);

        // this.float64 =
        //     fromData.float64 & ((this.int32 - this.lossyInt32) | this.float64) |
        //     this.float64 & ((fromData.int32 - fromData.lossyInt32) | fromData.float64)
        this->liveFloat64Syms->Or(&tempBv1, &tempBv2);

        // this.int32 &= fromData.int32
        // this.lossyInt32 = (fromData.lossyInt32 | this.lossyInt32) & this.int32
        this->liveInt32Syms->And(fromData->liveInt32Syms);
        this->liveLossyInt32Syms->Or(fromData->liveLossyInt32Syms);
        this->liveLossyInt32Syms->And(this->liveInt32Syms);
    }

    if (this->globOpt->TrackArgumentsObject())
    {
        if (!this->argObjSyms->Equal(fromData->argObjSyms))
        {
            this->globOpt->CannotAllocateArgumentsObjectOnStack(nullptr);
        }
    }

    if (fromData->maybeTempObjectSyms && !fromData->maybeTempObjectSyms->IsEmpty())
    {
        if (this->maybeTempObjectSyms)
        {
            this->maybeTempObjectSyms->Or(fromData->maybeTempObjectSyms);
        }
        else
        {
            this->maybeTempObjectSyms = fromData->maybeTempObjectSyms->CopyNew(this->globOpt->alloc);
        }

        if (fromData->canStoreTempObjectSyms && !fromData->canStoreTempObjectSyms->IsEmpty())
        {
            if (this->canStoreTempObjectSyms)
            {
                // Both need to be temp object
                this->canStoreTempObjectSyms->And(fromData->canStoreTempObjectSyms);
            }
        }
        else if (this->canStoreTempObjectSyms)
        {
            this->canStoreTempObjectSyms->ClearAll();
        }
    }
    else
    {
        Assert(!fromData->canStoreTempObjectSyms || fromData->canStoreTempObjectSyms->IsEmpty());
        if (this->canStoreTempObjectSyms)
        {
            this->canStoreTempObjectSyms->ClearAll();
        }
    }

    Assert(this->curFunc == fromData->curFunc);
    Assert((this->callSequence == nullptr && fromData->callSequence == nullptr) || this->callSequence->Equals(*(fromData->callSequence)));
    Assert(this->startCallCount == fromData->startCallCount);
    Assert(this->argOutCount == fromData->argOutCount);
    Assert(this->totalOutParamCount == fromData->totalOutParamCount);
    Assert(this->inlinedArgOutSize == fromData->inlinedArgOutSize);

    // stackLiteralInitFldDataMap is a union of the stack literal from two path.
    // Although we don't need the data on loop prepass, we need to do it for the loop header
    // because we capture the loop header bailout on loop prepass.
    if (fromData->stackLiteralInitFldDataMap != nullptr &&
        (!this->globOpt->IsLoopPrePass() || (toBlock->isLoopHeader && toBlock->loop == this->globOpt->rootLoopPrePass)))
    {
        if (this->stackLiteralInitFldDataMap == nullptr)
        {
            this->stackLiteralInitFldDataMap = fromData->stackLiteralInitFldDataMap->Clone();
        }
        else
        {
            StackLiteralInitFldDataMap * toMap = this->stackLiteralInitFldDataMap;
            fromData->stackLiteralInitFldDataMap->Map([toMap](StackSym * stackSym, StackLiteralInitFldData const& data)
            {
                if (toMap->AddNew(stackSym, data) == -1)
                {
                    // If there is an existing data for the stackSym, both path should match
                    DebugOnly(StackLiteralInitFldData const * currentData);
                    Assert(toMap->TryGetReference(stackSym, &currentData));
                    Assert(currentData->currentInitFldCount == data.currentInitFldCount);
                    Assert(currentData->propIds == data.propIds);
                }
            });
        }
    }
}